

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  Matrix<float,_2,_4> *pMVar5;
  Vector<float,_2> *b;
  Matrix<float,_2,_4> *pMVar6;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  Type in1;
  Type in0;
  undefined8 uStack_a0;
  float local_94 [3];
  Matrix<float,_2,_4> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48 [6];
  Matrix<float,_2,_4> local_30;
  
  puVar1 = &local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar9 = 0;
        }
        *(undefined4 *)(puVar1 + lVar7) = uVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
    local_68 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_60 = *(undefined8 *)evalCtx->in[1].m_data;
    local_58 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    puVar4 = &s_constInMat4x2;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar7) = puVar4[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 4;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
  }
  pfVar2 = (float *)&local_88;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pMVar5 = (Matrix<float,_2,_4> *)0x0;
    do {
      pMVar6 = (Matrix<float,_2,_4> *)0x0;
      do {
        uVar9 = 0x3f800000;
        if (pMVar5 != pMVar6) {
          uVar9 = 0;
        }
        pfVar2[(long)pMVar6 * 2] = (float)uVar9;
        pMVar6 = (Matrix<float,_2,_4> *)((long)(pMVar6->m_data).m_data[0].m_data + 1);
      } while (pMVar6 != (Matrix<float,_2,_4> *)0x4);
      b = (Vector<float,_2> *)((long)(pMVar5->m_data).m_data[0].m_data + 1);
      pfVar2 = pfVar2 + 1;
      bVar8 = pMVar5 == (Matrix<float,_2,_4> *)0x0;
      pMVar5 = (Matrix<float,_2,_4> *)b;
    } while (bVar8);
    local_88.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_88.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_88.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[3].m_data[0] = 0.0;
    local_88.m_data.m_data[3].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    b = (Vector<float,_2> *)&DAT_00b0baf0;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        pfVar2[lVar7 * 2] = (((Matrix<float,_2,_4> *)b)->m_data).m_data[0].m_data[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      pfVar2 = pfVar2 + 1;
      b = (((Matrix<float,_2,_4> *)b)->m_data).m_data + 2;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
  }
  uStack_a0 = 0x4926f0;
  matrixCompMult<float,2,4>
            (&local_30,(MatrixCaseUtils *)&local_68,&local_88,(Matrix<float,_2,_4> *)b);
  local_94[0] = local_30.m_data.m_data[0].m_data[0] + local_30.m_data.m_data[0].m_data[1] +
                local_30.m_data.m_data[3].m_data[0];
  local_94[1] = local_30.m_data.m_data[1].m_data[0] + local_30.m_data.m_data[1].m_data[1] +
                local_30.m_data.m_data[3].m_data[1];
  local_94[2] = local_30.m_data.m_data[2].m_data[0] + local_30.m_data.m_data[2].m_data[1];
  local_48[2] = 0;
  local_48[3] = 1;
  local_48[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_48[lVar3]] = *(float *)((long)&uStack_a0 + lVar3 * 4 + 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}